

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

int socketUnbind(int sockfd)

{
  int iVar1;
  socklen_t local_84;
  undefined1 local_7e [2];
  socklen_t len;
  sockaddr_un un;
  int sockfd_local;
  
  local_84 = 0x6e;
  un.sun_path._100_4_ = sockfd;
  iVar1 = getsockname(sockfd,(sockaddr *)local_7e,&local_84);
  if (iVar1 < 0) {
    un.sun_path[0x68] = -1;
    un.sun_path[0x69] = -1;
    un.sun_path[0x6a] = -1;
    un.sun_path[0x6b] = -1;
  }
  else if ((local_7e == (undefined1  [2])0x1) && (2 < local_84)) {
    un.sun_path._104_4_ = unlink((char *)&len);
  }
  else {
    un.sun_path[0x68] = '\0';
    un.sun_path[0x69] = '\0';
    un.sun_path[0x6a] = '\0';
    un.sun_path[0x6b] = '\0';
  }
  iVar1._0_1_ = un.sun_path[0x68];
  iVar1._1_1_ = un.sun_path[0x69];
  iVar1._2_1_ = un.sun_path[0x6a];
  iVar1._3_1_ = un.sun_path[0x6b];
  return iVar1;
}

Assistant:

static int socketUnbind(int sockfd)
{
	struct sockaddr_un un;
	socklen_t len = sizeof(un);
	
	if (getsockname(sockfd, (struct sockaddr *) &un, &len) < 0) {
		return -1;
	}
	if (un.sun_family == AF_UNIX && len > sizeof(un.sun_family)) {
		return unlink(un.sun_path);
	}
	return 0;
}